

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.cpp
# Opt level: O0

char * __thiscall libchars::commands::color_str(commands *this,command_colors_e color_idx)

{
  bool bVar1;
  command_colors_e color_idx_local;
  commands *this_local;
  
  bVar1 = editor::control(&this->edit);
  if (bVar1) {
    switch(color_idx) {
    case COLOR_NORMAL:
      this_local = (commands *)anon_var_dwarf_4e;
      break;
    case COLOR_UNKNOWN_TOKEN:
      this_local = (commands *)anon_var_dwarf_64;
      break;
    case COLOR_VALID_COMMAND:
      this_local = (commands *)anon_var_dwarf_7a;
      break;
    case COLOR_PARTIAL_COMMAND:
      this_local = (commands *)anon_var_dwarf_8e;
      break;
    case COLOR_INVALID_COMMAND:
      this_local = (commands *)anon_var_dwarf_84;
      break;
    case COLOR_COMPLETION:
      this_local = (commands *)anon_var_dwarf_98;
      break;
    case COLOR_QUOTED_STRING:
      this_local = (commands *)anon_var_dwarf_a2;
      break;
    case COLOR_VALID_ARGUMENT:
      this_local = (commands *)anon_var_dwarf_ac;
      break;
    case COLOR_PARTIAL_ARGUMENT:
      this_local = (commands *)anon_var_dwarf_4e;
      break;
    case COLOR_INVALID_ARGUMENT:
      this_local = (commands *)anon_var_dwarf_84;
      break;
    default:
      this_local = (commands *)0x13e7ce;
    }
  }
  else {
    this_local = (commands *)0x13e7ce;
  }
  return (char *)this_local;
}

Assistant:

const char *commands::color_str(command_colors_e color_idx) const
    {
        if (!edit.control())
            return "";

        switch (color_idx) {
        case COLOR_NORMAL:           return "\x1b[0m";
        case COLOR_UNKNOWN_TOKEN:    return "\x1b[0;31m";
        case COLOR_VALID_COMMAND:    return "\x1b[0;32m";
        case COLOR_INVALID_COMMAND:  return "\x1b[1;31m";
        case COLOR_PARTIAL_COMMAND:  return "\x1b[0;33m";
        case COLOR_COMPLETION:       return "\x1b[0;36m";
        case COLOR_QUOTED_STRING:    return "\x1b[1;34m";
        case COLOR_VALID_ARGUMENT:   return "\x1b[1m";
        case COLOR_PARTIAL_ARGUMENT: return "\x1b[0m";
        case COLOR_INVALID_ARGUMENT: return "\x1b[1;31m";
        default: return "";
        }
    }